

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::Compare
          (MessageDifferencer *this,Message *message1,Message *message2)

{
  char *pcVar1;
  bool bVar2;
  LogMessage *this_00;
  string_view str;
  string_view str_00;
  string_view v;
  string_view str_01;
  string_view v_00;
  Metadata MVar3;
  Metadata MVar4;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  parent_fields;
  StreamReporter reporter;
  StringOutputStream output_stream;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  local_88;
  StreamReporter local_68;
  StringOutputStream local_40;
  
  MVar3 = Message::GetMetadata(message1);
  MVar4 = Message::GetMetadata(message2);
  if (MVar3.descriptor == MVar4.descriptor) {
    local_88.
    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::clear(&(this->force_compare_no_presence_fields_).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           );
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->force_compare_failure_triggering_fields_).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
    if (this->output_string_ == (string *)0x0) {
      bVar2 = Compare(this,message1,message2,0,&local_88);
    }
    else {
      io::StringOutputStream::StringOutputStream(&local_40,this->output_string_);
      StreamReporter::StreamReporter(&local_68,&local_40.super_ZeroCopyOutputStream);
      this->reporter_ = &local_68.super_Reporter;
      local_68.message1_ = message1;
      local_68.message2_ = message2;
      bVar2 = Compare(this,message1,message2,0,&local_88);
      this->reporter_ = (Reporter *)0x0;
      StreamReporter::~StreamReporter(&local_68);
    }
    if (local_88.
        super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer.cc"
               ,0x215);
    str._M_str = "Comparison between two messages with different ";
    str._M_len = 0x2f;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_68,str);
    str_00._M_str = "descriptors. ";
    str_00._M_len = 0xd;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_68,str_00);
    pcVar1 = ((MVar3.descriptor)->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    v._M_str = pcVar1 + ~v._M_len;
    this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_68,v);
    str_01._M_str = " vs ";
    str_01._M_len = 4;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str_01)
    ;
    pcVar1 = ((MVar4.descriptor)->all_names_).payload_;
    v_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    v_00._M_str = pcVar1 + ~v_00._M_len;
    absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v_00);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_68);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool MessageDifferencer::Compare(const Message& message1,
                                 const Message& message2) {
  const Descriptor* descriptor1 = message1.GetDescriptor();
  const Descriptor* descriptor2 = message2.GetDescriptor();
  if (descriptor1 != descriptor2) {
    ABSL_DLOG(FATAL) << "Comparison between two messages with different "
                     << "descriptors. " << descriptor1->full_name() << " vs "
                     << descriptor2->full_name();
    return false;
  }

  std::vector<SpecificField> parent_fields;
  force_compare_no_presence_fields_.clear();
  force_compare_failure_triggering_fields_.clear();

  bool result = false;
  // Setup the internal reporter if need be.
  if (output_string_) {
    io::StringOutputStream output_stream(output_string_);
    StreamReporter reporter(&output_stream);
    reporter.SetMessages(message1, message2);
    reporter_ = &reporter;
    result = Compare(message1, message2, false, &parent_fields);
    reporter_ = nullptr;
  } else {
    result = Compare(message1, message2, false, &parent_fields);
  }
  return result;
}